

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O2

boolean lookup_id_mapping(uint gid,uint *nidp)

{
  ulong uVar1;
  ulong uVar2;
  bucket *pbVar3;
  ulong uVar4;
  
  if (n_ids_mapped != 0) {
    uVar1 = (long)n_ids_mapped % 0x40;
    if ((int)((long)n_ids_mapped % 0x40) == 0) {
      uVar1 = 0x40;
    }
    for (pbVar3 = id_map; pbVar3 != (bucket *)0x0; pbVar3 = pbVar3->next) {
      uVar2 = 0x40;
      if (pbVar3 == id_map) {
        uVar2 = uVar1 & 0xffffffff;
      }
      while (uVar4 = uVar2, 0 < (int)uVar4) {
        uVar2 = uVar4 - 1;
        if (pbVar3->map[uVar4 - 1].gid == gid) {
          *nidp = pbVar3->map[uVar4 - 1].nid;
          return '\x01';
        }
      }
    }
  }
  return '\0';
}

Assistant:

boolean lookup_id_mapping(unsigned gid, unsigned *nidp)
{
    int i;
    struct bucket *curr;

    if (n_ids_mapped)
	for (curr = id_map; curr; curr = curr->next) {
	    /* first bucket might not be totally full */
	    if (curr == id_map) {
		i = n_ids_mapped % N_PER_BUCKET;
		if (i == 0) i = N_PER_BUCKET;
	    } else
		i = N_PER_BUCKET;

	    while (--i >= 0)
		if (gid == curr->map[i].gid) {
		    *nidp = curr->map[i].nid;
		    return TRUE;
		}
	}

    return FALSE;
}